

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O3

int __thiscall
deqp::egl::anon_unknown_3::CreateContextExtCase::init(CreateContextExtCase *this,EVP_PKEY_CTX *ctx)

{
  pointer ppvVar1;
  pointer ppvVar2;
  EGLDisplay pvVar3;
  Library *egl;
  pointer extraout_RAX;
  pointer extraout_RAX_00;
  pointer ppvVar4;
  vector<void_*,_std::allocator<void_*>_> local_28;
  
  pvVar3 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  this->m_display = pvVar3;
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  eglu::chooseConfigs(&local_28,egl,this->m_display,&this->m_filter);
  ppvVar4 = local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  ppvVar1 = (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppvVar2 = (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (this->m_configs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (ppvVar1 != (pointer)0x0) {
    operator_delete(ppvVar1,(long)ppvVar2 - (long)ppvVar1);
    ppvVar4 = extraout_RAX;
    if (local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_28.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
      ppvVar4 = extraout_RAX_00;
    }
  }
  return (int)ppvVar4;
}

Assistant:

void CreateContextExtCase::init (void)
{
	m_display	= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_configs	= eglu::chooseConfigs(m_eglTestCtx.getLibrary(), m_display, m_filter);
}